

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQString * __thiscall SQStringTable::Add(SQStringTable *this,SQChar *news,SQInteger len)

{
  int iVar1;
  SQHash SVar2;
  SQString *this_00;
  ulong uVar3;
  SQString *t;
  SQString *s;
  SQHash h;
  SQHash newhash;
  SQInteger len_local;
  SQChar *news_local;
  SQStringTable *this_local;
  
  newhash = len;
  if (len < 0) {
    newhash = strlen(news);
  }
  SVar2 = _hashstr(news,newhash);
  uVar3 = SVar2 & this->_numofslots - 1;
  t = this->_strings[uVar3];
  while( true ) {
    if (t == (SQString *)0x0) {
      this_00 = (SQString *)sq_vm_malloc(newhash + 0x40);
      SQString::SQString(this_00);
      this_00->_sharedstate = this->_sharedstate;
      memcpy(this_00->_val,news,newhash);
      this_00->_val[newhash] = '\0';
      this_00->_len = newhash;
      this_00->_hash = SVar2;
      this_00->_next = this->_strings[uVar3];
      this->_strings[uVar3] = this_00;
      this->_slotused = this->_slotused + 1;
      if (this->_numofslots < this->_slotused) {
        Resize(this,this->_numofslots << 1);
      }
      return this_00;
    }
    if ((t->_len == newhash) && (iVar1 = memcmp(news,t->_val,newhash), iVar1 == 0)) break;
    t = t->_next;
  }
  return t;
}

Assistant:

SQString *SQStringTable::Add(const SQChar *news,SQInteger len)
{
    if(len<0)
        len = (SQInteger)scstrlen(news);
    SQHash newhash = ::_hashstr(news,len);
    SQHash h = newhash&(_numofslots-1);
    SQString *s;
    for (s = _strings[h]; s; s = s->_next){
        if(s->_len == len && (!memcmp(news,s->_val,sq_rsl(len))))
            return s; //found
    }

    SQString *t = (SQString *)SQ_MALLOC(sq_rsl(len)+sizeof(SQString));
    new (t) SQString;
    t->_sharedstate = _sharedstate;
    memcpy(t->_val,news,sq_rsl(len));
    t->_val[len] = _SC('\0');
    t->_len = len;
    t->_hash = newhash;
    t->_next = _strings[h];
    _strings[h] = t;
    _slotused++;
    if (_slotused > _numofslots)  /* too crowded? */
        Resize(_numofslots*2);
    return t;
}